

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::replaceZeroBitsWithZero(OptimizeInstructions *this,Expression *curr)

{
  Index IVar1;
  Const *last;
  Expression *pEVar2;
  Builder local_48;
  Literal local_40;
  
  if (curr->_id == ConstId) {
    __assert_fail("!curr->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0x13f,
                  "Expression *wasm::OptimizeInstructions::replaceZeroBitsWithZero(Expression *)");
  }
  if ((((curr->type).id & 0xfffffffffffffffe) == 2) &&
     (IVar1 = Bits::getMaxBits<wasm::OptimizeInstructions>(curr,this), IVar1 == 0)) {
    local_48.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    Literal::makeZero(&local_40,(Type)(curr->type).id);
    last = Builder::makeConst(&local_48,&local_40);
    Literal::~Literal(&local_40);
    pEVar2 = wasm::getDroppedChildrenAndAppend
                       (curr,(this->
                             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                             ).
                             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .
                             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .currModule,
                        &((this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                          ).super_Pass.runner)->options,(Expression *)last,NoticeParentEffects);
    return pEVar2;
  }
  return (Expression *)0x0;
}

Assistant:

Expression* replaceZeroBitsWithZero(Expression* curr) {
    // We should never be called with a constant.
    assert(!curr->is<Const>());

    if (!curr->type.isInteger() || Bits::getMaxBits(curr, this) != 0) {
      return nullptr;
    }

    auto zero = Builder(*getModule()).makeConst(Literal::makeZero(curr->type));
    return getDroppedChildrenAndAppend(curr, zero);
  }